

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::ConstDeclaration::ConstDeclaration(ConstDeclaration *this)

{
  allocator local_31;
  string local_30 [32];
  ConstDeclaration *local_10;
  ConstDeclaration *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"ConstDeclaration",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::vector<MyCompiler::ConstDefinition,_std::allocator<MyCompiler::ConstDefinition>_>::vector
            (&this->vConstDefinition);
  return;
}

Assistant:

MyCompiler::ConstDeclaration::ConstDeclaration()
        : AbstractAstNode("ConstDeclaration")
{}